

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O3

char * CVmBif::pop_str_val_ui(char *buf,size_t buflen)

{
  ushort *puVar1;
  size_t sVar2;
  vm_val_t val;
  char *local_30;
  vm_val_t local_28;
  
  local_28.typ = sp_[-1].typ;
  local_28._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  local_28.val = sp_[-1].val;
  sp_ = sp_ + -1;
  local_30 = buf;
  puVar1 = (ushort *)get_str_val(&local_28);
  if (buflen == 0) {
    sVar2 = CCharmapToLocal::map_utf8_alo
                      (G_cmap_to_ui_X,&local_30,(char *)(puVar1 + 1),(ulong)*puVar1);
    buf = local_30;
  }
  else {
    sVar2 = CCharmapToLocal::map_utf8
                      (G_cmap_to_ui_X,buf,buflen - 1,(char *)(puVar1 + 1),(ulong)*puVar1,
                       (size_t *)0x0);
  }
  buf[sVar2] = '\0';
  return local_30;
}

Assistant:

char *CVmBif::pop_str_val_ui(VMG_ char *buf, size_t buflen)
{
    /* pop the string value */
    const char *strp = pop_str_val(vmg0_);

    /* decode and skip the length prefix */
    size_t copy_len = vmb_get_len(strp);
    strp += VMB_LEN;

    /* 
     *   if they didn't allocate any space for the buffer, allocate one on
     *   the caller's behalf; otherwise map the string into the caller's
     *   buffer
     */
    if (buflen == 0)
    {
        /* the caller didn't provide a buffer, so allocate one */
        copy_len = G_cmap_to_ui->map_utf8_alo(&buf, strp, copy_len);
    }
    else
    {
        /* the caller provided a buffer, so use it for the mapping result */
        copy_len = G_cmap_to_ui->map_utf8(buf, buflen - 1, strp, copy_len, 0);
    }

    /* null-terminate the result */
    buf[copy_len] = '\0';

    /* return the buffer */
    return buf;
}